

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O1

void __thiscall
TPZEqnArray<std::complex<float>_>::EqnBackward
          (TPZEqnArray<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *U,
          DecomposeType dec)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  complex<float> *pcVar5;
  complex<float> *pcVar6;
  bool bVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  float fVar14;
  undefined8 uVar12;
  _ComplexT _Var13;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  if (this->fSymmetric == EIsNonSymmetric) {
    if (1 < (long)this->fNumEq) {
      lVar9 = (long)this->fNumEq;
      do {
        piVar4 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
        iVar2 = piVar4[lVar9 + -2];
        lVar8 = (long)iVar2;
        iVar3 = piVar4[lVar9 + -1];
        fVar17 = 0.0;
        fVar18 = 0.0;
        if (iVar2 + 1 < iVar3) {
          lVar11 = lVar8;
          do {
            lVar10 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                           [lVar11 + 1];
            if (((lVar10 < 0) ||
                ((U->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar10)) ||
               ((U->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<std::complex<float>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pcVar5 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                     super_TPZVec<std::complex<float>_>.fStore;
            _Var13 = U->fElem[lVar10]._M_value;
            fVar15 = *(float *)&pcVar5[lVar11 + 1]._M_value;
            fVar1 = *(float *)((long)&pcVar5[lVar11 + 1]._M_value + 4);
            fVar14 = (float)(_Var13 >> 0x20);
            fVar16 = fVar15 * (float)_Var13 - fVar14 * fVar1;
            fVar15 = fVar15 * fVar14 + (float)_Var13 * fVar1;
            if ((NAN(fVar16)) && (NAN(fVar15))) {
              uVar12 = __mulsc3(_Var13,fVar14);
              fVar16 = (float)uVar12;
              fVar15 = (float)((ulong)uVar12 >> 0x20);
            }
            fVar17 = fVar17 - fVar16;
            fVar18 = fVar18 - fVar15;
            lVar11 = lVar11 + 1;
          } while (iVar3 + -1 != (int)lVar11);
        }
        lVar11 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar8];
        if (((lVar11 < 0) ||
            ((U->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar11)) ||
           ((U->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<std::complex<float>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        _Var13 = U->fElem[lVar11]._M_value;
        U->fElem[lVar11]._M_value =
             CONCAT44(fVar18 + (float)(_Var13 >> 0x20),fVar17 + (float)_Var13);
        if ((dec & ~ELUPivot) == ELU) {
          pcVar5 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                   super_TPZVec<std::complex<float>_>.fStore;
          lVar11 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                         [lVar8];
          if (((lVar11 < 0) ||
              ((U->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar11)) ||
             ((U->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar6 = U->fElem;
          _Var13 = __divsc3((int)pcVar6[lVar11]._M_value,
                            *(undefined4 *)((long)&pcVar6[lVar11]._M_value + 4),
                            (int)pcVar5[lVar8]._M_value,
                            *(undefined4 *)((long)&pcVar5[lVar8]._M_value + 4));
          pcVar6[lVar11]._M_value = _Var13;
        }
        bVar7 = 3 < lVar9;
        lVar9 = lVar9 + -2;
      } while (bVar7);
    }
  }
  else if ((this->fSymmetric == EIsSymmetric) &&
          (lVar9 = (long)this->fNumEq, 0 < (long)this->fNumEq)) {
    do {
      piVar4 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
      iVar2 = piVar4[lVar9 + -1];
      lVar8 = (long)iVar2;
      iVar3 = piVar4[lVar9];
      fVar17 = 0.0;
      fVar18 = 0.0;
      if (iVar2 + 1 < iVar3) {
        lVar11 = lVar8;
        do {
          lVar10 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                         [lVar11 + 1];
          if (((lVar10 < 0) ||
              ((U->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar10)) ||
             ((U->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar5 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                   super_TPZVec<std::complex<float>_>.fStore;
          _Var13 = U->fElem[lVar10]._M_value;
          fVar15 = *(float *)&pcVar5[lVar11 + 1]._M_value;
          fVar1 = *(float *)((long)&pcVar5[lVar11 + 1]._M_value + 4);
          fVar14 = (float)(_Var13 >> 0x20);
          fVar16 = fVar15 * (float)_Var13 - fVar14 * fVar1;
          fVar15 = fVar15 * fVar14 + (float)_Var13 * fVar1;
          if ((NAN(fVar16)) && (NAN(fVar15))) {
            uVar12 = __mulsc3(_Var13,fVar14);
            fVar16 = (float)uVar12;
            fVar15 = (float)((ulong)uVar12 >> 0x20);
          }
          fVar17 = fVar17 - fVar16;
          fVar18 = fVar18 - fVar15;
          lVar11 = lVar11 + 1;
        } while (iVar3 + -1 != (int)lVar11);
      }
      lVar11 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar8];
      if (((lVar11 < 0) ||
          ((U->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar11)) ||
         ((U->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      _Var13 = U->fElem[lVar11]._M_value;
      U->fElem[lVar11]._M_value = CONCAT44(fVar18 + (float)(_Var13 >> 0x20),fVar17 + (float)_Var13);
      if (dec == ECholesky) {
        pcVar5 = (this->fEqValues).super_TPZManVector<std::complex<float>,_1000>.
                 super_TPZVec<std::complex<float>_>.fStore;
        lVar11 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar8];
        if (((lVar11 < 0) ||
            ((U->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar11)) ||
           ((U->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<std::complex<float>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pcVar6 = U->fElem;
        _Var13 = __divsc3((int)pcVar6[lVar11]._M_value,
                          *(undefined4 *)((long)&pcVar6[lVar11]._M_value + 4),
                          (int)pcVar5[lVar8]._M_value,
                          *(undefined4 *)((long)&pcVar5[lVar8]._M_value + 4));
        pcVar6[lVar11]._M_value = _Var13;
      }
      bVar7 = 1 < lVar9;
      lVar9 = lVar9 + -1;
    } while (bVar7);
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnBackward(TPZFMatrix<TVar> & U, DecomposeType dec) {
	int n;
	if(IsSymmetric()==EIsSymmetric){
    	for(n=fNumEq-1; n>=0; n--) {
    		int index = fEqStart[n]; 
    		int last_term = fEqStart[n + 1];
    		TVar acum = 0.;
    		int i;
    		for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky){
               	U(fIndex[index],0) /= fEqValues[index];
    		}
    	}
	}else if(IsSymmetric()==EIsNonSymmetric){
        for(n=fNumEq-2; n>=0; n-=2) {
            int index = fEqStart[n];
            int last_term = fEqStart[n + 1];
            TVar acum = 0.;
            int i;
            for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky || dec == ELU){
                U(fIndex[index],0) /= fEqValues[index];
            }
        }
    }
}